

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O3

void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  int iVar1;
  toplevel_callback_fn_t p_Var2;
  long *plVar3;
  LogContext *ctx;
  _Bool _Var4;
  char cVar5;
  uint32_t uVar6;
  int n_blanks;
  PacketQueueNode *pPVar7;
  Ssh *pSVar8;
  Ssh *pSVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  IdempotentCallback *pIVar14;
  size_t __n;
  Interactor *pIVar15;
  Ldisc **data;
  Ssh *pSVar16;
  _func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *p_Var17;
  InteractorVtable *pIVar18;
  byte bVar19;
  ptrlen pkt;
  ptrlen data_00;
  int decomplen;
  uchar lenbuf [4];
  uchar *decompblk;
  
  bVar19 = 0;
  iVar1 = *(int *)&bpp[-1].out_pq.pqb.end.next;
  if (iVar1 == 0) goto LAB_0011c2c2;
  if (iVar1 == 0x8f) goto LAB_0011c2d3;
  if (iVar1 == 0xa9) {
    pIVar14 = *(IdempotentCallback **)&bpp[-1].out_pq.pqb.end.on_free_queue;
    data = (Ldisc **)bpp[-1].out_pq.after;
    while( true ) {
      _Var4 = bufchain_try_fetch_consume(bpp->in_raw,data,(size_t)pIVar14);
      if (!_Var4) break;
      ssh_check_frozen(bpp->ssh);
      if (bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) {
        _Var4 = detect_attack(*(crcda_ctx **)&bpp[-1].ic_in_raw.queued,(uchar *)bpp[-1].out_pq.after
                              ,*(uint32_t *)&bpp[-1].out_pq.pqb.end.on_free_queue,
                              (uchar *)&bpp[-1].ic_out_pq);
        if (!_Var4) goto LAB_0011c3b9;
        pSVar8 = bpp->ssh;
        pcVar10 = "Network attack (CRC compensation) detected!";
LAB_0011c653:
        ssh_sw_abort(pSVar8,pcVar10);
        goto LAB_0011c65a;
      }
LAB_0011c3b9:
      lVar12 = *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue;
      if (lVar12 < 8) {
        __assert_fail("s->biglen >= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c"
                      ,0xb3,"void ssh1_bpp_handle_input(BinaryPacketProtocol *)");
      }
      p_Var17 = bpp[-1].out_pq.after;
      p_Var2 = bpp[-1].ic_in_raw.fn;
      bpp[-1].ic_out_pq.fn = *(toplevel_callback_fn_t *)(p_Var17 + lVar12 + -8);
      if (p_Var2 != (toplevel_callback_fn_t)0x0) {
        (**(code **)(*(long *)p_Var2 + 0x28))();
        lVar12 = *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue;
        p_Var17 = bpp[-1].out_pq.after;
      }
      data_00.len = lVar12 - 4;
      data_00.ptr = p_Var17;
      uVar6 = crc32_ssh1(data_00);
      *(uint32_t *)&bpp[-1].pls = uVar6;
      p_Var17 = bpp[-1].out_pq.after;
      uVar11 = *(uint *)(p_Var17 + *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue + -4);
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      *(uint *)((long)&bpp[-1].pls + 4) = uVar11;
      if (uVar11 != uVar6) {
        pSVar8 = bpp->ssh;
        pcVar10 = "Incorrect CRC received on packet";
        goto LAB_0011c653;
      }
      plVar3 = *(long **)&bpp[-1].remote_bugs;
      if (plVar3 == (long *)0x0) {
        pIVar18 = (InteractorVtable *)bpp[-1].out_pq.pqb.total_size;
      }
      else {
        cVar5 = (**(code **)(*plVar3 + 0x38))
                          (plVar3,p_Var17 + bpp[-1].out_pq.pqb.end.formal_size,
                           (int)bpp[-1].out_pq.pqb.total_size + 1,&decompblk,&decomplen);
        if (cVar5 == '\0') {
          pSVar8 = bpp->ssh;
          pcVar10 = "Zlib decompression encountered invalid data";
          goto LAB_0011c653;
        }
        sVar13 = bpp[-1].out_pq.pqb.end.formal_size;
        __n = (size_t)decomplen;
        pIVar14 = (IdempotentCallback *)(sVar13 + __n);
        if ((long)bpp[-1].out_pq.pqb.ic < (long)pIVar14) {
          pSVar8 = bpp[-1].ssh;
          bpp[-1].out_pq.pqb.ic = pIVar14;
          pSVar9 = (Ssh *)safemalloc(1,0x58,(size_t)pIVar14);
          bpp[-1].ssh = pSVar9;
          pSVar16 = pSVar8;
          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
            pSVar9->s = pSVar16->s;
            pSVar16 = (Ssh *)((long)pSVar16 + (ulong)bVar19 * -0x10 + 8);
            pSVar9 = (Ssh *)((long)pSVar9 + (ulong)bVar19 * -0x10 + 8);
          }
          sVar13 = *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue;
          bpp[-1].out_pq.after =
               (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)
               &(bpp[-1].ssh)->ldisc;
          smemclr(pSVar8,sVar13);
          safefree(pSVar8);
          sVar13 = bpp[-1].out_pq.pqb.end.formal_size;
          __n = (size_t)decomplen;
        }
        memcpy(bpp[-1].out_pq.after + sVar13,decompblk,__n);
        safefree(decompblk);
        pIVar18 = (InteractorVtable *)((long)decomplen - 1);
        bpp[-1].out_pq.pqb.total_size = (size_t)pIVar18;
        p_Var17 = bpp[-1].out_pq.after;
      }
      sVar13 = bpp[-1].out_pq.pqb.end.formal_size;
      pSVar8 = bpp[-1].ssh;
      pkt.ptr = (BackendVtable *)(p_Var17 + sVar13 + 1);
      bpp[-1].out_pq.after =
           (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)pkt.ptr;
      uVar11 = (uint)(byte)p_Var17[sVar13];
      *(uint *)&pSVar8->s = uVar11;
      (pSVar8->backend).vt = pkt.ptr;
      (pSVar8->interactor).vt = pIVar18;
      (pSVar8->backend).interactor = (Interactor *)0x0;
      *(undefined4 *)&(pSVar8->interactor).parent = 0;
      (pSVar8->interactor).last_to_talk = (Interactor *)&pSVar8->backend;
      pIVar15 = (Interactor *)0x0;
      if (bpp->logctx != (LogContext *)0x0) {
        pkt.len = (size_t)pIVar18;
        n_blanks = ssh1_censor_packet(bpp->pls,uVar11,false,pkt,(logblank_t *)&decompblk);
        ctx = bpp->logctx;
        iVar1 = *(int *)&(bpp[-1].ssh)->s;
        pcVar10 = ssh1_pkt_type(iVar1);
        pSVar8 = bpp[-1].ssh;
        pIVar15 = (pSVar8->backend).interactor;
        log_packet(ctx,0,iVar1,pcVar10,(void *)((long)&pIVar15->vt + (long)(pSVar8->backend).vt),
                   (long)(pSVar8->interactor).vt - (long)pIVar15,n_blanks,(logblank_t *)&decompblk,
                   (unsigned_long *)0x0,0,(char *)0x0);
        pSVar8 = bpp[-1].ssh;
        pIVar15 = (pSVar8->backend).interactor;
        pIVar18 = (pSVar8->interactor).vt;
      }
      *(long *)&pSVar8->remote_bugs = (long)pIVar18 - (long)pIVar15;
      pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)&pSVar8->conf);
      uVar11 = *(uint *)&(bpp[-1].ssh)->s;
      bpp[-1].ssh = (Ssh *)0x0;
      if (((uVar11 & 0xfffffffe) == 0xe) && (*(char *)&bpp[-1].ic_out_pq.ctx == '\x01')) {
        if (uVar11 == 0xe) {
          ssh1_bpp_start_compression(bpp);
        }
        *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 0;
        queue_idempotent_callback(&bpp->ic_out_pq);
      }
LAB_0011c2c2:
      bpp[-1].out_pq.pqb.total_size = 0;
      bpp[-1].out_pq.pqb.ic = (IdempotentCallback *)0x0;
      *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0x8f;
LAB_0011c2d3:
      _Var4 = bufchain_try_fetch_consume(bpp->in_raw,lenbuf,4);
      if (!_Var4) break;
      ssh_check_frozen(bpp->ssh);
      uVar11 = (uint)lenbuf >> 0x18 | ((uint)lenbuf & 0xff0000) >> 8 | ((uint)lenbuf & 0xff00) << 8
               | (int)lenbuf << 0x18;
      pPVar7 = (PacketQueueNode *)(long)(int)uVar11;
      bpp[-1].out_pq.pqb.end.prev = pPVar7;
      if (uVar11 - 0x40001 < 0xfffc0004) {
        pSVar8 = bpp->ssh;
        pcVar10 = "Out-of-range packet length from remote suggests data stream corruption";
        goto LAB_0011c653;
      }
      sVar13 = 8 - (ulong)((uint)lenbuf >> 0x18 & 7);
      bpp[-1].out_pq.pqb.end.formal_size = sVar13;
      sVar13 = sVar13 + (long)pPVar7;
      *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue = sVar13;
      bpp[-1].out_pq.pqb.total_size = (size_t)&pPVar7[-1].field_0x1b;
      pSVar8 = (Ssh *)safemalloc(1,0x58,sVar13);
      bpp[-1].ssh = pSVar8;
      *(undefined1 *)&(pSVar8->plug).vt = 0;
      *(undefined4 *)&pSVar8->s = 0;
      pSVar8->conf = (Conf *)0x0;
      (pSVar8->version_receiver).got_ssh_version = (_func_void_ssh_version_receiver_ptr_int *)0x0;
      pIVar14 = *(IdempotentCallback **)&bpp[-1].out_pq.pqb.end.on_free_queue;
      bpp[-1].out_pq.pqb.ic = pIVar14;
      data = &pSVar8->ldisc;
      bpp[-1].out_pq.after = (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)data;
      *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0xa9;
    }
    if (bpp->input_eof != false) {
      if (bpp->expect_close == false) {
        ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
      }
      else {
        ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
      }
    }
  }
  else {
LAB_0011c65a:
    *(undefined4 *)&bpp[-1].out_pq.pqb.end.next = 0;
  }
  return;
}

Assistant:

static void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        s->maxlen = 0;
        s->length = 0;

        {
            unsigned char lenbuf[4];
            BPP_READ(lenbuf, 4);
            s->len = toint(GET_32BIT_MSB_FIRST(lenbuf));
        }

        if (s->len < 5 || s->len > 262144) { /* SSH1.5-mandated max size */
            ssh_sw_abort(s->bpp.ssh,
                         "Out-of-range packet length from remote suggests"
                         " data stream corruption");
            crStopV;
        }

        s->pad = 8 - (s->len % 8);
        s->biglen = s->len + s->pad;
        s->length = s->len - 5;

        /*
         * Allocate the packet to return, now we know its length.
         */
        s->pktin = snew_plus(PktIn, s->biglen);
        s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
        s->pktin->qnode.on_free_queue = false;
        s->pktin->type = 0;

        s->maxlen = s->biglen;
        s->data = snew_plus_get_aux(s->pktin);

        BPP_READ(s->data, s->biglen);

        if (s->cipher_in && detect_attack(s->crcda_ctx,
                                          s->data, s->biglen, s->iv)) {
            ssh_sw_abort(s->bpp.ssh,
                         "Network attack (CRC compensation) detected!");
            crStopV;
        }
        /* Save the last cipher block, to be passed to the next call
         * to detect_attack */
        assert(s->biglen >= 8);
        memcpy(s->iv, s->data + s->biglen - 8, sizeof(s->iv));

        if (s->cipher_in)
            ssh_cipher_decrypt(s->cipher_in, s->data, s->biglen);

        s->realcrc = crc32_ssh1(make_ptrlen(s->data, s->biglen - 4));
        s->gotcrc = GET_32BIT_MSB_FIRST(s->data + s->biglen - 4);
        if (s->gotcrc != s->realcrc) {
            ssh_sw_abort(s->bpp.ssh, "Incorrect CRC received on packet");
            crStopV;
        }

        if (s->decompctx) {
            unsigned char *decompblk;
            int decomplen;
            if (!ssh_decompressor_decompress(
                    s->decompctx, s->data + s->pad, s->length + 1,
                    &decompblk, &decomplen)) {
                ssh_sw_abort(s->bpp.ssh,
                             "Zlib decompression encountered invalid data");
                crStopV;
            }

            if (s->maxlen < s->pad + decomplen) {
                PktIn *old_pktin = s->pktin;

                s->maxlen = s->pad + decomplen;
                s->pktin = snew_plus(PktIn, s->maxlen);
                *s->pktin = *old_pktin; /* structure copy */
                s->data = snew_plus_get_aux(s->pktin);

                smemclr(old_pktin, s->biglen);
                sfree(old_pktin);
            }

            memcpy(s->data + s->pad, decompblk, decomplen);
            sfree(decompblk);
            s->length = decomplen - 1;
        }

        /*
         * Now we can find the bounds of the semantic content of the
         * packet, and the initial type byte.
         */
        s->data += s->pad;
        s->pktin->type = *s->data++;
        BinarySource_INIT(s->pktin, s->data, s->length);

        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh1_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->length), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh1_pkt_type(s->pktin->type),
                       get_ptr(s->pktin), get_avail(s->pktin), nblanks, blanks,
                       NULL, 0, NULL);
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);

        {
            int type = s->pktin->type;
            s->pktin = NULL;

            switch (type) {
              case SSH1_SMSG_SUCCESS:
              case SSH1_SMSG_FAILURE:
                if (s->pending_compression_request) {
                    /*
                     * This is the response to
                     * SSH1_CMSG_REQUEST_COMPRESSION.
                     */
                    if (type == SSH1_SMSG_SUCCESS) {
                        /*
                         * If the response was positive, start
                         * compression.
                         */
                        ssh1_bpp_start_compression(&s->bpp);
                    }

                    /*
                     * Either way, cancel the pending flag, and
                     * schedule a run of our output side in case we
                     * had any packets queued up in the meantime.
                     */
                    s->pending_compression_request = false;
                    queue_idempotent_callback(&s->bpp.ic_out_pq);
                }
                break;
            }
        }
    }

  eof:
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}